

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::BrIf(w3Interp *this)

{
  uint32_t uVar1;
  uint32_t condition;
  w3Interp *this_local;
  
  uVar1 = w3Stack::pop_u32(&this->super_w3Stack);
  if (uVar1 == 0) {
    printf("BrIfNotTaken condition:%X label:%X\n",0,
           (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
  }
  else {
    printf("BrIfTaken condition:%X label:%X\n",(ulong)uVar1,
           (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
    Br(this);
  }
  return;
}

Assistant:

INTERP (BrIf)
{
    //DumpStack ("brIfStart");

    const uint32_t condition = pop_u32 ();

    if (condition)
    {
        printf ("BrIfTaken condition:%X label:%X\n", condition, instr->u32);
        Br ();
    }
    else
    {
        printf ("BrIfNotTaken condition:%X label:%X\n", condition, instr->u32);
    }
    //DumpStack ("brIfEnd");
}